

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_attributes_uint16(void *a,uint16_t **attrib)

{
  uint *puVar1;
  uint nr_of_indices;
  long lVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint8_t *b1;
  uint8_t *b2;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  iVar7 = 0;
  iVar8 = 0;
  if ((*(int *)((long)a + 0x24) == 0x12) && (iVar8 = iVar7, *(int *)((long)a + 0x40) == 0)) {
    lVar2 = *(long *)((long)a + 0x10);
    puVar3 = *(uint **)((long)a + 0x18);
    uVar4 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
      nr_of_indices = *puVar3;
      *(uint **)((long)a + 0x18) = puVar3 + 1;
      if ((ulong)((long)(puVar3 + 1) + (4 - lVar2)) <= uVar4) {
        uVar5 = puVar3[1];
        uVar9 = (ulong)uVar5;
        puVar1 = puVar3 + 2;
        *(uint **)((long)a + 0x18) = puVar1;
        pcVar6 = (char *)malloc(uVar9);
        if ((long)puVar3 + ((uVar9 + 8) - lVar2) <= uVar4) {
          memcpy(pcVar6,puVar1,uVar9);
          *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar9;
          b1 = (uint8_t *)malloc((ulong)nr_of_indices);
          uVar5 = LZ4_decompress_safe(pcVar6,(char *)b1,uVar5,nr_of_indices);
          if (uVar5 != nr_of_indices) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x5bd,"int trico_read_attributes_uint16(void *, uint16_t **)");
          }
          if (*(int *)((long)a + 0x40) == 0) {
            lVar2 = *(long *)((long)a + 0x10);
            puVar3 = *(uint **)((long)a + 0x18);
            uVar4 = *(ulong *)((long)a + 0x30);
            if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
              uVar5 = *puVar3;
              uVar9 = (ulong)uVar5;
              puVar1 = puVar3 + 1;
              *(uint **)((long)a + 0x18) = puVar1;
              pcVar6 = (char *)realloc(pcVar6,uVar9);
              if ((long)puVar3 + ((uVar9 + 4) - lVar2) <= uVar4) {
                memcpy(pcVar6,puVar1,uVar9);
                *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar9;
                b2 = (uint8_t *)malloc((ulong)nr_of_indices);
                uVar5 = LZ4_decompress_safe(pcVar6,(char *)b2,uVar5,nr_of_indices);
                if (uVar5 != nr_of_indices) {
                  __assert_fail("bytes_decompressed == nr_of_attribs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                ,0x5c6,"int trico_read_attributes_uint16(void *, uint16_t **)");
                }
                if (attrib != (uint16_t **)0x0) {
                  trico_transpose_uint16_soa_to_aos(attrib,b1,b2,nr_of_indices);
                }
                free(pcVar6);
                free(b1);
                free(b2);
                read_next_stream_type((trico_archive *)a);
                iVar8 = 1;
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int trico_read_attributes_uint16(void* a, uint16_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint16_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint16_soa_to_aos(attrib, decompressed_b1, decompressed_b2, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);

  read_next_stream_type(arch);

  return 1;
  }